

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vtls.c
# Opt level: O3

_Bool Curl_ssl_getsessionid
                (Curl_cfilter *cf,Curl_easy *data,ssl_peer *peer,void **ssl_sessionid,size_t *idsize
                )

{
  connectdata *pcVar1;
  Curl_share *pCVar2;
  Curl_ssl_session *pCVar3;
  curl_trc_feat *pcVar4;
  long lVar5;
  bool bVar6;
  _Bool _Var7;
  int iVar8;
  connectdata *pcVar9;
  uint uVar10;
  char *pcVar11;
  ssl_primary_config *c2;
  ssl_config_data *psVar12;
  long *plVar13;
  long lVar14;
  ulong uVar15;
  bool bVar16;
  
  pcVar1 = cf->conn;
  bVar16 = (~cf->cft->flags & 10U) == 0;
  psVar12 = &(data->set).ssl;
  if (bVar16) {
    psVar12 = &(data->set).proxy_ssl;
  }
  *ssl_sessionid = (void *)0x0;
  bVar6 = true;
  if ((((psVar12->primary).field_0x79 & 8) != 0) &&
     ((data->state).session != (Curl_ssl_session *)0x0)) {
    pCVar2 = data->share;
    if ((pCVar2 == (Curl_share *)0x0) || ((pCVar2->specifier & 0x10) == 0)) {
      plVar13 = &(data->state).sessionage;
    }
    else {
      plVar13 = &pCVar2->sessionage;
    }
    bVar6 = true;
    if ((data->set).general_ssl.max_ssl_sessions != 0) {
      lVar14 = 0x48;
      uVar15 = 0;
      do {
        pCVar3 = (data->state).session;
        if ((*(long *)((long)pCVar3 + lVar14 + -0x30) != 0) &&
           (iVar8 = curl_strequal(peer->hostname,*(char **)((long)pCVar3 + lVar14 + -0x48)),
           iVar8 != 0)) {
          pcVar9 = cf->conn;
          uVar10 = SUB84(pcVar9->bits,0);
          pcVar11 = *(char **)((long)pCVar3 + lVar14 + -0x40);
          if ((uVar10 >> 8 & 1) == 0) {
            if (pcVar11 == (char *)0x0) {
LAB_0016bf93:
              iVar8 = *(int *)((long)pCVar3 + lVar14 + -0xc);
              if ((uVar10 >> 9 & 1) == 0) {
                if (iVar8 == -1) {
LAB_0016bfb2:
                  if ((((peer->port == *(int *)((long)pCVar3 + lVar14 + -0x10)) &&
                       (peer->transport == *(int *)((long)pCVar3 + lVar14 + -8))) &&
                      (iVar8 = curl_strequal(pcVar9->handler->scheme,
                                             *(char **)((long)pCVar3 + lVar14 + -0x38)), iVar8 != 0)
                      ) && (_Var7 = match_ssl_primary_config
                                              ((Curl_easy *)
                                               (&pcVar1->shutdown_poll + (ulong)bVar16 * 4 + 1),
                                               (ssl_primary_config *)((long)&pCVar3->name + lVar14),
                                               c2), _Var7)) {
                    lVar5 = *plVar13;
                    *plVar13 = lVar5 + 1;
                    *(long *)((long)pCVar3 + lVar14 + -0x18) = lVar5 + 1;
                    *ssl_sessionid = *(void **)((long)pCVar3 + lVar14 + -0x30);
                    if (idsize != (size_t *)0x0) {
                      *idsize = *(size_t *)((long)pCVar3 + lVar14 + -0x28);
                    }
                    bVar6 = false;
                    if (data == (Curl_easy *)0x0) {
                      return false;
                    }
                    goto LAB_0016c010;
                  }
                }
              }
              else if ((iVar8 != -1) && (pcVar9->conn_to_port == iVar8)) goto LAB_0016bfb2;
            }
          }
          else if ((pcVar11 != (char *)0x0) &&
                  (iVar8 = curl_strequal((pcVar9->conn_to_host).name,pcVar11), iVar8 != 0)) {
            pcVar9 = cf->conn;
            uVar10 = SUB84(pcVar9->bits,0);
            goto LAB_0016bf93;
          }
        }
        uVar15 = uVar15 + 1;
        lVar14 = lVar14 + 200;
      } while (uVar15 < (data->set).general_ssl.max_ssl_sessions);
      bVar6 = true;
    }
LAB_0016c010:
    if (((((data->set).field_0x8cd & 0x10) != 0) &&
        ((pcVar4 = (data->state).feat, pcVar4 == (curl_trc_feat *)0x0 || (0 < pcVar4->log_level))))
       && (0 < cf->cft->log_level)) {
      pcVar11 = "Found";
      if (bVar6) {
        pcVar11 = "No";
      }
      Curl_trc_cf_infof(data,cf,"%s cached session ID for %s://%s:%d",pcVar11,
                        cf->conn->handler->scheme,peer->hostname,peer->port);
    }
  }
  return bVar6;
}

Assistant:

bool Curl_ssl_getsessionid(struct Curl_cfilter *cf,
                           struct Curl_easy *data,
                           const struct ssl_peer *peer,
                           void **ssl_sessionid,
                           size_t *idsize) /* set 0 if unknown */
{
  struct ssl_primary_config *conn_config = Curl_ssl_cf_get_primary_config(cf);
  struct ssl_config_data *ssl_config = Curl_ssl_cf_get_config(cf, data);
  struct Curl_ssl_session *check;
  size_t i;
  long *general_age;
  bool no_match = TRUE;

  *ssl_sessionid = NULL;
  if(!ssl_config)
    return TRUE;

  DEBUGASSERT(ssl_config->primary.cache_session);

  if(!ssl_config->primary.cache_session || !data->state.session)
    /* session ID reuse is disabled or the session cache has not been
       setup */
    return TRUE;

  /* Lock if shared */
  if(SSLSESSION_SHARED(data))
    general_age = &data->share->sessionage;
  else
    general_age = &data->state.sessionage;

  for(i = 0; i < data->set.general_ssl.max_ssl_sessions; i++) {
    check = &data->state.session[i];
    if(!check->sessionid)
      /* not session ID means blank entry */
      continue;
    if(strcasecompare(peer->hostname, check->name) &&
       ((!cf->conn->bits.conn_to_host && !check->conn_to_host) ||
        (cf->conn->bits.conn_to_host && check->conn_to_host &&
         strcasecompare(cf->conn->conn_to_host.name, check->conn_to_host))) &&
       ((!cf->conn->bits.conn_to_port && check->conn_to_port == -1) ||
        (cf->conn->bits.conn_to_port && check->conn_to_port != -1 &&
         cf->conn->conn_to_port == check->conn_to_port)) &&
       (peer->port == check->remote_port) &&
       (peer->transport == check->transport) &&
       strcasecompare(cf->conn->handler->scheme, check->scheme) &&
       match_ssl_primary_config(data, conn_config, &check->ssl_config)) {
      /* yes, we have a session ID! */
      (*general_age)++;          /* increase general age */
      check->age = *general_age; /* set this as used in this age */
      *ssl_sessionid = check->sessionid;
      if(idsize)
        *idsize = check->idsize;
      no_match = FALSE;
      break;
    }
  }

  CURL_TRC_CF(data, cf, "%s cached session ID for %s://%s:%d",
              no_match? "No": "Found",
              cf->conn->handler->scheme, peer->hostname, peer->port);
  return no_match;
}